

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boostdep.cpp
# Opt level: O1

void __thiscall
module_level_txt_actions::module2(module_level_txt_actions *this,string *module,int level)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(module->_M_dataplus)._M_p,module->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"(",1);
  if (level < 0x3fffffff) {
    std::ostream::operator<<((ostream *)&std::cout,level);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"-",1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
  return;
}

Assistant:

void module2( std::string const & module, int level )
    {
        std::cout << " " << module << "(";

        if( level >= unknown_level )
        {
            std::cout << "-";
        }
        else
        {
            std::cout << level;
        }

        std::cout << ")";
    }